

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::BVHNIntersector1<4,_16781328,_true,_embree::avx::VirtualCurveIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  char cVar12;
  AABBNodeMB4D *node1;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong *puVar18;
  ulong uVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  vint4 bi_1;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  vint4 bi;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  vint4 bi_2;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  vfloat4 a0;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  vint4 ai_1;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar62;
  vint4 ai;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar71;
  float fVar74;
  float fVar75;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar76;
  float fVar77;
  float fVar80;
  float fVar81;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  Precalculations pre;
  NodeRef stack [244];
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818 [4];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if ((local_7d8 != 8) && (fVar3 = ray->tfar, 0.0 <= fVar3)) {
    aVar8 = (ray->dir).field_0.field_1;
    auVar33 = vdpps_avx((undefined1  [16])aVar8,(undefined1  [16])aVar8,0x7f);
    auVar34 = vrsqrtss_avx(auVar33,auVar33);
    fVar52 = auVar34._0_4_;
    local_818[0] = fVar52 * 1.5 - auVar33._0_4_ * 0.5 * fVar52 * fVar52 * fVar52;
    fVar52 = (ray->dir).field_0.m128[0];
    fVar4 = (ray->dir).field_0.m128[1];
    fVar5 = (ray->dir).field_0.m128[2];
    auVar36 = vshufps_avx(ZEXT416((uint)local_818[0]),ZEXT416((uint)local_818[0]),0);
    auVar27._0_4_ = aVar8.x * auVar36._0_4_;
    auVar27._4_4_ = aVar8.y * auVar36._4_4_;
    auVar27._8_4_ = aVar8.z * auVar36._8_4_;
    auVar27._12_4_ = aVar8.field_3.w * auVar36._12_4_;
    auVar34 = vshufpd_avx(auVar27,auVar27,1);
    auVar33 = vmovshdup_avx(auVar27);
    auVar68._8_4_ = 0x80000000;
    auVar68._0_8_ = 0x8000000080000000;
    auVar68._12_4_ = 0x80000000;
    auVar57._12_4_ = 0;
    auVar57._0_12_ = ZEXT812(0);
    auVar57 = auVar57 << 0x20;
    auVar65 = vunpckhps_avx(auVar27,auVar57);
    auVar43 = vshufps_avx(auVar65,ZEXT416(auVar33._0_4_ ^ 0x80000000),0x41);
    auVar65._0_8_ = auVar34._0_8_ ^ 0x8000000080000000;
    auVar65._8_8_ = auVar34._8_8_ ^ auVar68._8_8_;
    auVar65 = vinsertps_avx(auVar65,auVar27,0x2a);
    auVar33 = vdpps_avx(auVar43,auVar43,0x7f);
    auVar34 = vdpps_avx(auVar65,auVar65,0x7f);
    auVar33 = vcmpps_avx(auVar34,auVar33,1);
    auVar33 = vshufps_avx(auVar33,auVar33,0);
    auVar33 = vblendvps_avx(auVar65,auVar43,auVar33);
    auVar34 = vdpps_avx(auVar33,auVar33,0x7f);
    auVar65 = vrsqrtss_avx(auVar34,auVar34);
    fVar62 = auVar65._0_4_;
    auVar34 = ZEXT416((uint)(fVar62 * 1.5 - auVar34._0_4_ * 0.5 * fVar62 * fVar62 * fVar62));
    auVar34 = vshufps_avx(auVar34,auVar34,0);
    auVar66._0_4_ = auVar33._0_4_ * auVar34._0_4_;
    auVar66._4_4_ = auVar33._4_4_ * auVar34._4_4_;
    auVar66._8_4_ = auVar33._8_4_ * auVar34._8_4_;
    auVar66._12_4_ = auVar33._12_4_ * auVar34._12_4_;
    auVar33 = vshufps_avx(auVar66,auVar66,0xc9);
    auVar34 = vshufps_avx(auVar27,auVar27,0xc9);
    auVar70._0_4_ = auVar34._0_4_ * auVar66._0_4_;
    auVar70._4_4_ = auVar34._4_4_ * auVar66._4_4_;
    auVar70._8_4_ = auVar34._8_4_ * auVar66._8_4_;
    auVar70._12_4_ = auVar34._12_4_ * auVar66._12_4_;
    auVar69._0_4_ = auVar33._0_4_ * auVar27._0_4_;
    auVar69._4_4_ = auVar33._4_4_ * auVar27._4_4_;
    auVar69._8_4_ = auVar33._8_4_ * auVar27._8_4_;
    auVar69._12_4_ = auVar33._12_4_ * auVar27._12_4_;
    auVar33 = vsubps_avx(auVar69,auVar70);
    auVar65 = vshufps_avx(auVar33,auVar33,0xc9);
    auVar33 = vdpps_avx(auVar65,auVar65,0x7f);
    auVar34 = vrsqrtss_avx(auVar33,auVar33);
    fVar62 = auVar34._0_4_;
    auVar33 = ZEXT416((uint)(fVar62 * 1.5 - auVar33._0_4_ * 0.5 * fVar62 * fVar62 * fVar62));
    auVar33 = vshufps_avx(auVar33,auVar33,0);
    auVar34._0_4_ = auVar65._0_4_ * auVar33._0_4_;
    auVar34._4_4_ = auVar65._4_4_ * auVar33._4_4_;
    auVar34._8_4_ = auVar65._8_4_ * auVar33._8_4_;
    auVar34._12_4_ = auVar65._12_4_ * auVar33._12_4_;
    auVar33._0_4_ = auVar36._0_4_ * auVar27._0_4_;
    auVar33._4_4_ = auVar36._4_4_ * auVar27._4_4_;
    auVar33._8_4_ = auVar36._8_4_ * auVar27._8_4_;
    auVar33._12_4_ = auVar36._12_4_ * auVar27._12_4_;
    auVar65 = vunpcklps_avx(auVar66,auVar33);
    auVar33 = vunpckhps_avx(auVar66,auVar33);
    auVar36 = vunpcklps_avx(auVar34,auVar57);
    auVar34 = vunpckhps_avx(auVar34,auVar57);
    local_7e8 = vunpcklps_avx(auVar33,auVar34);
    local_808 = vunpcklps_avx(auVar65,auVar36);
    local_7f8 = vunpckhps_avx(auVar65,auVar36);
    puVar18 = local_7d0;
    auVar65 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->org).field_0.m128[3]));
    auVar36._8_4_ = 0x7fffffff;
    auVar36._0_8_ = 0x7fffffff7fffffff;
    auVar36._12_4_ = 0x7fffffff;
    auVar33 = vandps_avx((undefined1  [16])aVar8,auVar36);
    auVar43._8_4_ = 0x219392ef;
    auVar43._0_8_ = 0x219392ef219392ef;
    auVar43._12_4_ = 0x219392ef;
    auVar33 = vcmpps_avx(auVar33,auVar43,1);
    auVar44._8_4_ = 0x3f800000;
    auVar44._0_8_ = 0x3f8000003f800000;
    auVar44._12_4_ = 0x3f800000;
    auVar34 = vdivps_avx(auVar44,(undefined1  [16])aVar8);
    auVar45._8_4_ = 0x5d5e0b6b;
    auVar45._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar45._12_4_ = 0x5d5e0b6b;
    auVar33 = vblendvps_avx(auVar34,auVar45,auVar33);
    auVar37._0_4_ = auVar33._0_4_ * 0.99999964;
    auVar37._4_4_ = auVar33._4_4_ * 0.99999964;
    auVar37._8_4_ = auVar33._8_4_ * 0.99999964;
    auVar37._12_4_ = auVar33._12_4_ * 0.99999964;
    auVar22._0_4_ = auVar33._0_4_ * 1.0000004;
    auVar22._4_4_ = auVar33._4_4_ * 1.0000004;
    auVar22._8_4_ = auVar33._8_4_ * 1.0000004;
    auVar22._12_4_ = auVar33._12_4_ * 1.0000004;
    auVar36 = vshufps_avx(auVar37,auVar37,0);
    auVar33 = vmovshdup_avx(auVar37);
    auVar43 = vshufps_avx(auVar37,auVar37,0x55);
    auVar34 = vshufpd_avx(auVar37,auVar37,1);
    auVar57 = vshufps_avx(auVar37,auVar37,0xaa);
    uVar20 = (ulong)(auVar37._0_4_ < 0.0) * 0x10;
    auVar37 = vshufps_avx(auVar22,auVar22,0);
    uVar17 = (ulong)(auVar33._0_4_ < 0.0) << 4 | 0x20;
    auVar33 = vshufps_avx(auVar22,auVar22,0x55);
    auVar22 = vshufps_avx(auVar22,auVar22,0xaa);
    uVar19 = (ulong)(auVar34._0_4_ < 0.0) << 4 | 0x40;
    auVar34 = vshufps_avx(auVar65,auVar65,0);
    auVar65 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
    fVar3 = (ray->org).field_0.m128[0];
    auVar89._4_4_ = fVar3;
    auVar89._0_4_ = fVar3;
    auVar89._8_4_ = fVar3;
    auVar89._12_4_ = fVar3;
    fVar62 = (ray->org).field_0.m128[1];
    fVar6 = (ray->org).field_0.m128[2];
LAB_00b6322e:
    if (puVar18 != &local_7d8) {
      uVar14 = puVar18[-1];
      puVar18 = puVar18 + -1;
      do {
        fVar7 = (ray->dir).field_0.m128[3];
        auVar21._4_4_ = fVar7;
        auVar21._0_4_ = fVar7;
        auVar21._8_4_ = fVar7;
        auVar21._12_4_ = fVar7;
        fVar71 = 1.0 - fVar7;
        auVar44 = vshufps_avx(ZEXT416((uint)fVar71),ZEXT416((uint)fVar71),0);
        auVar45 = vshufps_avx(ZEXT416((uint)(fVar71 * 0.0)),ZEXT416((uint)(fVar71 * 0.0)),0);
        do {
          if ((uVar14 & 8) != 0) {
            cVar12 = (**(code **)((long)This->leafIntersector +
                                 (ulong)*(byte *)(uVar14 & 0xfffffffffffffff0) * 0x40 + 8))
                               (local_818,ray,context);
            if (cVar12 != '\0') {
              ray->tfar = -INFINITY;
              return;
            }
            goto LAB_00b6322e;
          }
          uVar15 = (uint)uVar14 & 7;
          uVar13 = uVar14 & 0xfffffffffffffff0;
          if (uVar15 == 3) {
            auVar72._0_4_ =
                 fVar52 * *(float *)(uVar13 + 0x20) +
                 *(float *)(uVar13 + 0x50) * fVar4 + *(float *)(uVar13 + 0x80) * fVar5;
            auVar72._4_4_ =
                 fVar52 * *(float *)(uVar13 + 0x24) +
                 *(float *)(uVar13 + 0x54) * fVar4 + *(float *)(uVar13 + 0x84) * fVar5;
            auVar72._8_4_ =
                 fVar52 * *(float *)(uVar13 + 0x28) +
                 *(float *)(uVar13 + 0x58) * fVar4 + *(float *)(uVar13 + 0x88) * fVar5;
            auVar72._12_4_ =
                 fVar52 * *(float *)(uVar13 + 0x2c) +
                 *(float *)(uVar13 + 0x5c) * fVar4 + *(float *)(uVar13 + 0x8c) * fVar5;
            auVar78._0_4_ =
                 fVar52 * *(float *)(uVar13 + 0x30) +
                 fVar4 * *(float *)(uVar13 + 0x60) + *(float *)(uVar13 + 0x90) * fVar5;
            auVar78._4_4_ =
                 fVar52 * *(float *)(uVar13 + 0x34) +
                 fVar4 * *(float *)(uVar13 + 100) + *(float *)(uVar13 + 0x94) * fVar5;
            auVar78._8_4_ =
                 fVar52 * *(float *)(uVar13 + 0x38) +
                 fVar4 * *(float *)(uVar13 + 0x68) + *(float *)(uVar13 + 0x98) * fVar5;
            auVar78._12_4_ =
                 fVar52 * *(float *)(uVar13 + 0x3c) +
                 fVar4 * *(float *)(uVar13 + 0x6c) + *(float *)(uVar13 + 0x9c) * fVar5;
            auVar87._0_4_ =
                 fVar52 * *(float *)(uVar13 + 0x40) +
                 fVar4 * *(float *)(uVar13 + 0x70) + *(float *)(uVar13 + 0xa0) * fVar5;
            auVar87._4_4_ =
                 fVar52 * *(float *)(uVar13 + 0x44) +
                 fVar4 * *(float *)(uVar13 + 0x74) + *(float *)(uVar13 + 0xa4) * fVar5;
            auVar87._8_4_ =
                 fVar52 * *(float *)(uVar13 + 0x48) +
                 fVar4 * *(float *)(uVar13 + 0x78) + *(float *)(uVar13 + 0xa8) * fVar5;
            auVar87._12_4_ =
                 fVar52 * *(float *)(uVar13 + 0x4c) +
                 fVar4 * *(float *)(uVar13 + 0x7c) + *(float *)(uVar13 + 0xac) * fVar5;
            auVar28._8_4_ = 0x7fffffff;
            auVar28._0_8_ = 0x7fffffff7fffffff;
            auVar28._12_4_ = 0x7fffffff;
            auVar27 = vandps_avx(auVar72,auVar28);
            auVar35._8_4_ = 0x219392ef;
            auVar35._0_8_ = 0x219392ef219392ef;
            auVar35._12_4_ = 0x219392ef;
            auVar27 = vcmpps_avx(auVar27,auVar35,1);
            auVar66 = vblendvps_avx(auVar72,auVar35,auVar27);
            auVar27 = vandps_avx(auVar78,auVar28);
            auVar27 = vcmpps_avx(auVar27,auVar35,1);
            auVar68 = vblendvps_avx(auVar78,auVar35,auVar27);
            auVar27 = vandps_avx(auVar87,auVar28);
            auVar27 = vcmpps_avx(auVar27,auVar35,1);
            auVar27 = vblendvps_avx(auVar87,auVar35,auVar27);
            auVar69 = vrcpps_avx(auVar66);
            fVar71 = auVar69._0_4_;
            auVar73._0_4_ = auVar66._0_4_ * fVar71;
            fVar74 = auVar69._4_4_;
            auVar73._4_4_ = auVar66._4_4_ * fVar74;
            fVar75 = auVar69._8_4_;
            auVar73._8_4_ = auVar66._8_4_ * fVar75;
            fVar76 = auVar69._12_4_;
            auVar73._12_4_ = auVar66._12_4_ * fVar76;
            auVar29._8_4_ = 0x3f800000;
            auVar29._0_8_ = 0x3f8000003f800000;
            auVar29._12_4_ = 0x3f800000;
            auVar66 = vsubps_avx(auVar29,auVar73);
            fVar71 = fVar71 + fVar71 * auVar66._0_4_;
            fVar74 = fVar74 + fVar74 * auVar66._4_4_;
            fVar75 = fVar75 + fVar75 * auVar66._8_4_;
            fVar76 = fVar76 + fVar76 * auVar66._12_4_;
            auVar66 = vrcpps_avx(auVar68);
            fVar77 = auVar66._0_4_;
            auVar79._0_4_ = auVar68._0_4_ * fVar77;
            fVar80 = auVar66._4_4_;
            auVar79._4_4_ = auVar68._4_4_ * fVar80;
            fVar81 = auVar66._8_4_;
            auVar79._8_4_ = auVar68._8_4_ * fVar81;
            fVar82 = auVar66._12_4_;
            auVar79._12_4_ = auVar68._12_4_ * fVar82;
            auVar66 = vsubps_avx(auVar29,auVar79);
            fVar77 = fVar77 + fVar77 * auVar66._0_4_;
            fVar80 = fVar80 + fVar80 * auVar66._4_4_;
            fVar81 = fVar81 + fVar81 * auVar66._8_4_;
            fVar82 = fVar82 + fVar82 * auVar66._12_4_;
            auVar66 = vrcpps_avx(auVar27);
            fVar83 = auVar66._0_4_;
            auVar88._0_4_ = auVar27._0_4_ * fVar83;
            fVar84 = auVar66._4_4_;
            auVar88._4_4_ = auVar27._4_4_ * fVar84;
            fVar85 = auVar66._8_4_;
            auVar88._8_4_ = auVar27._8_4_ * fVar85;
            fVar86 = auVar66._12_4_;
            auVar88._12_4_ = auVar27._12_4_ * fVar86;
            auVar27 = vsubps_avx(auVar29,auVar88);
            fVar83 = fVar83 + fVar83 * auVar27._0_4_;
            fVar84 = fVar84 + fVar84 * auVar27._4_4_;
            fVar85 = fVar85 + fVar85 * auVar27._8_4_;
            fVar86 = fVar86 + fVar86 * auVar27._12_4_;
            auVar30._0_4_ =
                 fVar3 * *(float *)(uVar13 + 0x20) +
                 *(float *)(uVar13 + 0x50) * fVar62 +
                 *(float *)(uVar13 + 0x80) * fVar6 + *(float *)(uVar13 + 0xb0);
            auVar30._4_4_ =
                 fVar3 * *(float *)(uVar13 + 0x24) +
                 *(float *)(uVar13 + 0x54) * fVar62 +
                 *(float *)(uVar13 + 0x84) * fVar6 + *(float *)(uVar13 + 0xb4);
            auVar30._8_4_ =
                 fVar3 * *(float *)(uVar13 + 0x28) +
                 *(float *)(uVar13 + 0x58) * fVar62 +
                 *(float *)(uVar13 + 0x88) * fVar6 + *(float *)(uVar13 + 0xb8);
            auVar30._12_4_ =
                 fVar3 * *(float *)(uVar13 + 0x2c) +
                 *(float *)(uVar13 + 0x5c) * fVar62 +
                 *(float *)(uVar13 + 0x8c) * fVar6 + *(float *)(uVar13 + 0xbc);
            auVar50._0_4_ =
                 fVar3 * *(float *)(uVar13 + 0x30) +
                 *(float *)(uVar13 + 0x90) * fVar6 + *(float *)(uVar13 + 0xc0) +
                 fVar62 * *(float *)(uVar13 + 0x60);
            auVar50._4_4_ =
                 fVar3 * *(float *)(uVar13 + 0x34) +
                 *(float *)(uVar13 + 0x94) * fVar6 + *(float *)(uVar13 + 0xc4) +
                 fVar62 * *(float *)(uVar13 + 100);
            auVar50._8_4_ =
                 fVar3 * *(float *)(uVar13 + 0x38) +
                 *(float *)(uVar13 + 0x98) * fVar6 + *(float *)(uVar13 + 200) +
                 fVar62 * *(float *)(uVar13 + 0x68);
            auVar50._12_4_ =
                 fVar3 * *(float *)(uVar13 + 0x3c) +
                 *(float *)(uVar13 + 0x9c) * fVar6 + *(float *)(uVar13 + 0xcc) +
                 fVar62 * *(float *)(uVar13 + 0x6c);
            local_828 = auVar45._0_4_;
            fStack_824 = auVar45._4_4_;
            fStack_820 = auVar45._8_4_;
            fStack_81c = auVar45._12_4_;
            auVar67._0_4_ = fVar7 * *(float *)(uVar13 + 0xe0) + local_828;
            auVar67._4_4_ = fVar7 * *(float *)(uVar13 + 0xe4) + fStack_824;
            auVar67._8_4_ = fVar7 * *(float *)(uVar13 + 0xe8) + fStack_820;
            auVar67._12_4_ = fVar7 * *(float *)(uVar13 + 0xec) + fStack_81c;
            auVar55._0_4_ = local_828 + fVar7 * *(float *)(uVar13 + 0xf0);
            auVar55._4_4_ = fStack_824 + fVar7 * *(float *)(uVar13 + 0xf4);
            auVar55._8_4_ = fStack_820 + fVar7 * *(float *)(uVar13 + 0xf8);
            auVar55._12_4_ = fStack_81c + fVar7 * *(float *)(uVar13 + 0xfc);
            auVar63._0_4_ = local_828 + fVar7 * *(float *)(uVar13 + 0x100);
            auVar63._4_4_ = fStack_824 + fVar7 * *(float *)(uVar13 + 0x104);
            auVar63._8_4_ = fStack_820 + fVar7 * *(float *)(uVar13 + 0x108);
            auVar63._12_4_ = fStack_81c + fVar7 * *(float *)(uVar13 + 0x10c);
            auVar40._0_4_ =
                 fVar3 * *(float *)(uVar13 + 0x40) +
                 *(float *)(uVar13 + 0xa0) * fVar6 + *(float *)(uVar13 + 0xd0) +
                 fVar62 * *(float *)(uVar13 + 0x70);
            auVar40._4_4_ =
                 fVar3 * *(float *)(uVar13 + 0x44) +
                 *(float *)(uVar13 + 0xa4) * fVar6 + *(float *)(uVar13 + 0xd4) +
                 fVar62 * *(float *)(uVar13 + 0x74);
            auVar40._8_4_ =
                 fVar3 * *(float *)(uVar13 + 0x48) +
                 *(float *)(uVar13 + 0xa8) * fVar6 + *(float *)(uVar13 + 0xd8) +
                 fVar62 * *(float *)(uVar13 + 0x78);
            auVar40._12_4_ =
                 fVar3 * *(float *)(uVar13 + 0x4c) +
                 *(float *)(uVar13 + 0xac) * fVar6 + *(float *)(uVar13 + 0xdc) +
                 fVar62 * *(float *)(uVar13 + 0x7c);
            local_938 = auVar44._0_4_;
            fStack_934 = auVar44._4_4_;
            fStack_930 = auVar44._8_4_;
            fStack_92c = auVar44._12_4_;
            auVar58._0_4_ = local_938 + fVar7 * *(float *)(uVar13 + 0x110);
            auVar58._4_4_ = fStack_934 + fVar7 * *(float *)(uVar13 + 0x114);
            auVar58._8_4_ = fStack_930 + fVar7 * *(float *)(uVar13 + 0x118);
            auVar58._12_4_ = fStack_92c + fVar7 * *(float *)(uVar13 + 0x11c);
            auVar27 = vsubps_avx(auVar67,auVar30);
            auVar66 = vsubps_avx(auVar58,auVar30);
            auVar59._0_4_ = local_938 + fVar7 * *(float *)(uVar13 + 0x120);
            auVar59._4_4_ = fStack_934 + fVar7 * *(float *)(uVar13 + 0x124);
            auVar59._8_4_ = fStack_930 + fVar7 * *(float *)(uVar13 + 0x128);
            auVar59._12_4_ = fStack_92c + fVar7 * *(float *)(uVar13 + 300);
            auVar68 = vsubps_avx(auVar55,auVar50);
            auVar69 = vsubps_avx(auVar59,auVar50);
            auVar60._0_4_ = local_938 + fVar7 * *(float *)(uVar13 + 0x130);
            auVar60._4_4_ = fStack_934 + fVar7 * *(float *)(uVar13 + 0x134);
            auVar60._8_4_ = fStack_930 + fVar7 * *(float *)(uVar13 + 0x138);
            auVar60._12_4_ = fStack_92c + fVar7 * *(float *)(uVar13 + 0x13c);
            auVar70 = vsubps_avx(auVar63,auVar40);
            auVar28 = vsubps_avx(auVar60,auVar40);
            auVar61._0_4_ = auVar27._0_4_ * fVar71;
            auVar61._4_4_ = auVar27._4_4_ * fVar74;
            auVar61._8_4_ = auVar27._8_4_ * fVar75;
            auVar61._12_4_ = auVar27._12_4_ * fVar76;
            auVar31._0_4_ = fVar71 * auVar66._0_4_;
            auVar31._4_4_ = fVar74 * auVar66._4_4_;
            auVar31._8_4_ = fVar75 * auVar66._8_4_;
            auVar31._12_4_ = fVar76 * auVar66._12_4_;
            auVar56._0_4_ = fVar77 * auVar68._0_4_;
            auVar56._4_4_ = fVar80 * auVar68._4_4_;
            auVar56._8_4_ = fVar81 * auVar68._8_4_;
            auVar56._12_4_ = fVar82 * auVar68._12_4_;
            auVar64._0_4_ = fVar83 * auVar70._0_4_;
            auVar64._4_4_ = fVar84 * auVar70._4_4_;
            auVar64._8_4_ = fVar85 * auVar70._8_4_;
            auVar64._12_4_ = fVar86 * auVar70._12_4_;
            auVar51._0_4_ = fVar77 * auVar69._0_4_;
            auVar51._4_4_ = fVar80 * auVar69._4_4_;
            auVar51._8_4_ = fVar81 * auVar69._8_4_;
            auVar51._12_4_ = fVar82 * auVar69._12_4_;
            auVar41._0_4_ = fVar83 * auVar28._0_4_;
            auVar41._4_4_ = fVar84 * auVar28._4_4_;
            auVar41._8_4_ = fVar85 * auVar28._8_4_;
            auVar41._12_4_ = fVar86 * auVar28._12_4_;
            auVar27 = vpminsd_avx(auVar56,auVar51);
            auVar66 = vpminsd_avx(auVar64,auVar41);
            auVar27 = vmaxps_avx(auVar27,auVar66);
            auVar70 = vpminsd_avx(auVar61,auVar31);
            auVar69 = vpmaxsd_avx(auVar61,auVar31);
            auVar66 = vpmaxsd_avx(auVar56,auVar51);
            auVar68 = vpmaxsd_avx(auVar64,auVar41);
            auVar68 = vminps_avx(auVar66,auVar68);
            auVar66 = vmaxps_avx(auVar34,auVar70);
            auVar27 = vmaxps_avx(auVar66,auVar27);
            auVar66 = vminps_avx(auVar65,auVar69);
            auVar66 = vminps_avx(auVar66,auVar68);
            auVar42._0_4_ = auVar27._0_4_ * 0.99999964;
            auVar42._4_4_ = auVar27._4_4_ * 0.99999964;
            auVar42._8_4_ = auVar27._8_4_ * 0.99999964;
            auVar42._12_4_ = auVar27._12_4_ * 0.99999964;
            auVar32._0_4_ = auVar66._0_4_ * 1.0000004;
            auVar32._4_4_ = auVar66._4_4_ * 1.0000004;
            auVar32._8_4_ = auVar66._8_4_ * 1.0000004;
            auVar32._12_4_ = auVar66._12_4_ * 1.0000004;
            auVar27 = vcmpps_avx(auVar42,auVar32,2);
          }
          else {
            pfVar2 = (float *)(uVar13 + 0x80 + uVar20);
            pfVar1 = (float *)(uVar13 + 0x20 + uVar20);
            auVar23._0_4_ = fVar7 * *pfVar2 + *pfVar1;
            auVar23._4_4_ = fVar7 * pfVar2[1] + pfVar1[1];
            auVar23._8_4_ = fVar7 * pfVar2[2] + pfVar1[2];
            auVar23._12_4_ = fVar7 * pfVar2[3] + pfVar1[3];
            auVar27 = vsubps_avx(auVar23,auVar89);
            pfVar2 = (float *)(uVar13 + 0x80 + uVar17);
            auVar24._0_4_ = auVar36._0_4_ * auVar27._0_4_;
            auVar24._4_4_ = auVar36._4_4_ * auVar27._4_4_;
            auVar24._8_4_ = auVar36._8_4_ * auVar27._8_4_;
            auVar24._12_4_ = auVar36._12_4_ * auVar27._12_4_;
            pfVar1 = (float *)(uVar13 + 0x20 + uVar17);
            auVar38._0_4_ = fVar7 * *pfVar2 + *pfVar1;
            auVar38._4_4_ = fVar7 * pfVar2[1] + pfVar1[1];
            auVar38._8_4_ = fVar7 * pfVar2[2] + pfVar1[2];
            auVar38._12_4_ = fVar7 * pfVar2[3] + pfVar1[3];
            auVar11._4_4_ = fVar62;
            auVar11._0_4_ = fVar62;
            auVar11._8_4_ = fVar62;
            auVar11._12_4_ = fVar62;
            auVar27 = vsubps_avx(auVar38,auVar11);
            pfVar2 = (float *)(uVar13 + 0x80 + uVar19);
            pfVar1 = (float *)(uVar13 + 0x20 + uVar19);
            auVar46._0_4_ = fVar7 * *pfVar2 + *pfVar1;
            auVar46._4_4_ = fVar7 * pfVar2[1] + pfVar1[1];
            auVar46._8_4_ = fVar7 * pfVar2[2] + pfVar1[2];
            auVar46._12_4_ = fVar7 * pfVar2[3] + pfVar1[3];
            auVar39._0_4_ = auVar43._0_4_ * auVar27._0_4_;
            auVar39._4_4_ = auVar43._4_4_ * auVar27._4_4_;
            auVar39._8_4_ = auVar43._8_4_ * auVar27._8_4_;
            auVar39._12_4_ = auVar43._12_4_ * auVar27._12_4_;
            auVar10._4_4_ = fVar6;
            auVar10._0_4_ = fVar6;
            auVar10._8_4_ = fVar6;
            auVar10._12_4_ = fVar6;
            auVar27 = vsubps_avx(auVar46,auVar10);
            auVar47._0_4_ = auVar57._0_4_ * auVar27._0_4_;
            auVar47._4_4_ = auVar57._4_4_ * auVar27._4_4_;
            auVar47._8_4_ = auVar57._8_4_ * auVar27._8_4_;
            auVar47._12_4_ = auVar57._12_4_ * auVar27._12_4_;
            auVar27 = vmaxps_avx(auVar39,auVar47);
            auVar66 = vmaxps_avx(auVar34,auVar24);
            auVar27 = vmaxps_avx(auVar66,auVar27);
            pfVar2 = (float *)(uVar13 + 0x80 + (uVar20 ^ 0x10));
            pfVar1 = (float *)(uVar13 + 0x20 + (uVar20 ^ 0x10));
            auVar25._0_4_ = fVar7 * *pfVar2 + *pfVar1;
            auVar25._4_4_ = fVar7 * pfVar2[1] + pfVar1[1];
            auVar25._8_4_ = fVar7 * pfVar2[2] + pfVar1[2];
            auVar25._12_4_ = fVar7 * pfVar2[3] + pfVar1[3];
            auVar66 = vsubps_avx(auVar25,auVar89);
            auVar26._0_4_ = auVar37._0_4_ * auVar66._0_4_;
            auVar26._4_4_ = auVar37._4_4_ * auVar66._4_4_;
            auVar26._8_4_ = auVar37._8_4_ * auVar66._8_4_;
            auVar26._12_4_ = auVar37._12_4_ * auVar66._12_4_;
            pfVar2 = (float *)(uVar13 + 0x80 + (uVar17 ^ 0x10));
            pfVar1 = (float *)(uVar13 + 0x20 + (uVar17 ^ 0x10));
            auVar48._0_4_ = fVar7 * *pfVar2 + *pfVar1;
            auVar48._4_4_ = fVar7 * pfVar2[1] + pfVar1[1];
            auVar48._8_4_ = fVar7 * pfVar2[2] + pfVar1[2];
            auVar48._12_4_ = fVar7 * pfVar2[3] + pfVar1[3];
            auVar66 = vsubps_avx(auVar48,auVar11);
            auVar49._0_4_ = auVar33._0_4_ * auVar66._0_4_;
            auVar49._4_4_ = auVar33._4_4_ * auVar66._4_4_;
            auVar49._8_4_ = auVar33._8_4_ * auVar66._8_4_;
            auVar49._12_4_ = auVar33._12_4_ * auVar66._12_4_;
            pfVar2 = (float *)(uVar13 + 0x80 + (uVar19 ^ 0x10));
            pfVar1 = (float *)(uVar13 + 0x20 + (uVar19 ^ 0x10));
            auVar53._0_4_ = fVar7 * *pfVar2 + *pfVar1;
            auVar53._4_4_ = fVar7 * pfVar2[1] + pfVar1[1];
            auVar53._8_4_ = fVar7 * pfVar2[2] + pfVar1[2];
            auVar53._12_4_ = fVar7 * pfVar2[3] + pfVar1[3];
            auVar66 = vsubps_avx(auVar53,auVar10);
            auVar54._0_4_ = auVar22._0_4_ * auVar66._0_4_;
            auVar54._4_4_ = auVar22._4_4_ * auVar66._4_4_;
            auVar54._8_4_ = auVar22._8_4_ * auVar66._8_4_;
            auVar54._12_4_ = auVar22._12_4_ * auVar66._12_4_;
            auVar66 = vminps_avx(auVar49,auVar54);
            auVar68 = vminps_avx(auVar65,auVar26);
            auVar66 = vminps_avx(auVar68,auVar66);
            if (uVar15 == 6) {
              auVar66 = vcmpps_avx(auVar27,auVar66,2);
              auVar27 = vcmpps_avx(*(undefined1 (*) [16])(uVar13 + 0xe0),auVar21,2);
              auVar68 = vcmpps_avx(auVar21,*(undefined1 (*) [16])(uVar13 + 0xf0),1);
              auVar27 = vandps_avx(auVar27,auVar68);
              auVar27 = vandps_avx(auVar27,auVar66);
            }
            else {
              auVar27 = vcmpps_avx(auVar27,auVar66,2);
            }
          }
          auVar27 = vpslld_avx(auVar27,0x1f);
          uVar15 = vmovmskps_avx(auVar27);
          if (uVar15 == 0) goto LAB_00b6322e;
          uVar15 = uVar15 & 0xff;
          lVar9 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
            }
          }
          uVar14 = *(ulong *)(uVar13 + lVar9 * 8);
          uVar15 = uVar15 - 1 & uVar15;
          uVar16 = (ulong)uVar15;
        } while (uVar15 == 0);
        do {
          *puVar18 = uVar14;
          puVar18 = puVar18 + 1;
          lVar9 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
            }
          }
          uVar14 = *(ulong *)(uVar13 + lVar9 * 8);
          uVar16 = uVar16 - 1 & uVar16;
        } while (uVar16 != 0);
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }